

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O0

void __thiscall Logic_Order_Test::Logic_Order_Test(Logic_Order_Test *this)

{
  Logic_Order_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Logic_Order_Test_00243f98;
  return;
}

Assistant:

TEST(Logic, Order) {
	MockParser mock(
		"let a = 3\n"
		"let b = 4\n"
		"let c = a <= b\n"
		"let d = a >= b\n"
	);

	INS2(BC_SET_N, 0, 0);
	INS2(BC_SET_N, 1, 1);

	INS2(BC_GT_LL, 0, 1);
	JMP(3);
	INS2(BC_SET_P, 2, PRIM_TRUE);
	JMP(2);
	INS2(BC_SET_P, 2, PRIM_FALSE);

	INS2(BC_LT_LL, 0, 1);
	JMP(3);
	INS2(BC_SET_P, 3, PRIM_TRUE);
	JMP(2);
	INS2(BC_SET_P, 3, PRIM_FALSE);

	INS(BC_RET, 0, 0, 0);
}